

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeHangLimitCheck(TranslateToFuzzReader *this)

{
  Builder *this_00;
  string_view sVar1;
  GlobalGet *pGVar2;
  Unary *condition;
  Const *pCVar3;
  GlobalSet *pGVar4;
  Expression *right;
  Block *pBVar5;
  If *left;
  Binary *value;
  ulong uVar6;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  
  this_00 = &this->builder;
  pGVar2 = Builder::makeGlobalGet
                     (this_00,(Name)(this->HANG_LIMIT_GLOBAL).super_IString.str,(Type)0x2);
  condition = Builder::makeUnary(this_00,EqZInt32,(Expression *)pGVar2);
  sVar1 = (this->HANG_LIMIT_GLOBAL).super_IString.str;
  pCVar3 = Builder::makeConst<int>(this_00,(this->fuzzParams->super_FuzzParams).HANG_LIMIT);
  pGVar4 = Builder::makeGlobalSet(this_00,(Name)sVar1,(Expression *)pCVar3);
  right = (Expression *)Builder::makeUnreachable(this_00);
  uVar6 = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pCVar3;
  pBVar5 = Builder::makeSequence(this_00,(Expression *)pGVar4,right,type);
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar6;
  left = Builder::makeIf(this_00,(Expression *)condition,(Expression *)pBVar5,(Expression *)0x0,
                         type_01);
  sVar1 = (this->HANG_LIMIT_GLOBAL).super_IString.str;
  pGVar2 = Builder::makeGlobalGet
                     (this_00,(Name)(this->HANG_LIMIT_GLOBAL).super_IString.str,(Type)0x2);
  pCVar3 = Builder::makeConst<int>(this_00,1);
  value = Builder::makeBinary(this_00,SubInt32,(Expression *)pGVar2,(Expression *)pCVar3);
  pGVar4 = Builder::makeGlobalSet(this_00,(Name)sVar1,(Expression *)value);
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)value;
  pBVar5 = Builder::makeSequence(this_00,(Expression *)left,(Expression *)pGVar4,type_00);
  return (Expression *)pBVar5;
}

Assistant:

Expression* TranslateToFuzzReader::makeHangLimitCheck() {
  // If the hang limit global reaches 0 then we trap and reset it. That allows
  // calls to other exports to proceed, with hang checking, after the trap halts
  // the currently called export.
  return builder.makeSequence(
    builder.makeIf(
      builder.makeUnary(UnaryOp::EqZInt32,
                        builder.makeGlobalGet(HANG_LIMIT_GLOBAL, Type::i32)),
      builder.makeSequence(builder.makeGlobalSet(HANG_LIMIT_GLOBAL,
                                                 builder.makeConst(int32_t(
                                                   fuzzParams->HANG_LIMIT))),
                           builder.makeUnreachable())),
    builder.makeGlobalSet(
      HANG_LIMIT_GLOBAL,
      builder.makeBinary(BinaryOp::SubInt32,
                         builder.makeGlobalGet(HANG_LIMIT_GLOBAL, Type::i32),
                         builder.makeConst(int32_t(1)))));
}